

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_ustar_filename.c
# Opt level: O0

void test_read_format_ustar_filename_KOI8R_UTF8(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  la_int64_t lVar4;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname_local;
  
  a = (archive *)refname;
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                   ,L'ă');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    ae = (archive_entry *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                     ,L'ć',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                        ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
    iVar1 = archive_read_support_format_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                        ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
    iVar1 = archive_read_set_options((archive *)ae,"hdrcharset=KOI8-R");
    if (iVar1 == 0) {
      wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Đ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ē',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      pcVar3 = archive_entry_pathname(local_20);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                 ,L'ĕ',anon_var_dwarf_214ce,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ė',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ė',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ę',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ě',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      pcVar3 = archive_entry_pathname(local_20);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                 ,L'ĝ',anon_var_dwarf_214ac,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ğ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ğ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ġ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ĥ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      iVar1 = archive_filter_code((archive *)ae,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ħ',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,ae);
      iVar1 = archive_format((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'Ĩ',0x30001,"ARCHIVE_FORMAT_TAR_USTAR",(long)iVar1,"archive_format(a)",
                          ae);
      iVar1 = archive_read_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                          ,L'ī',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                     ,L'ċ');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    }
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_ustar_filename.c"
                        ,L'ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

static void
test_read_format_ustar_filename_KOI8R_UTF8(const char *refname)
{
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read KOI8-R filename in en_US.UTF-8 with "hdrcharset=KOI8-R" option.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=KOI8-R")) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to UTF-8.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xd0\xbf\xd1\x80\xd0\xb8\xd0\xb2\xd0\xb5\xd1\x82",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xd0\x9f\xd0\xa0\xd0\x98\xd0\x92\xd0\x95\xd0\xa2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_USTAR, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}